

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraphReadJSON.cxx
# Opt level: O1

ReadFileResult
anon_unknown.dwarf_10aa22c::SubConditionHelper
          (unique_ptr<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
           *out,Value *value)

{
  Condition *pCVar1;
  _Head_base<0UL,_cmCMakePresetsGraph::Condition_*,_false> _Var2;
  ReadFileResult RVar3;
  int iVar4;
  pointer *__ptr;
  ReadFileResult RVar5;
  pointer __p;
  unique_ptr<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
  ptr;
  _Head_base<0UL,_cmCMakePresetsGraph::Condition_*,_false> local_28;
  
  local_28._M_head_impl = (Condition *)0x0;
  RVar3 = ConditionHelper((unique_ptr<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
                           *)&local_28,value);
  _Var2._M_head_impl = local_28._M_head_impl;
  if (local_28._M_head_impl != (Condition *)0x0) {
    iVar4 = (*(local_28._M_head_impl)->_vptr_Condition[3])(local_28._M_head_impl);
    RVar5 = INVALID_CONDITION;
    if ((char)iVar4 != '\0') goto LAB_0033d0f1;
  }
  local_28._M_head_impl = (Condition *)0x0;
  pCVar1 = (out->_M_t).
           super___uniq_ptr_impl<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
           ._M_t.
           super__Tuple_impl<0UL,_cmCMakePresetsGraph::Condition_*,_std::default_delete<cmCMakePresetsGraph::Condition>_>
           .super__Head_base<0UL,_cmCMakePresetsGraph::Condition_*,_false>._M_head_impl;
  (out->_M_t).
  super___uniq_ptr_impl<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
  ._M_t.
  super__Tuple_impl<0UL,_cmCMakePresetsGraph::Condition_*,_std::default_delete<cmCMakePresetsGraph::Condition>_>
  .super__Head_base<0UL,_cmCMakePresetsGraph::Condition_*,_false>._M_head_impl = _Var2._M_head_impl;
  RVar5 = RVar3;
  if (pCVar1 != (Condition *)0x0) {
    (*pCVar1->_vptr_Condition[1])();
  }
LAB_0033d0f1:
  if (local_28._M_head_impl != (Condition *)0x0) {
    (*(local_28._M_head_impl)->_vptr_Condition[1])();
  }
  return RVar5;
}

Assistant:

ReadFileResult SubConditionHelper(
  std::unique_ptr<cmCMakePresetsGraph::Condition>& out,
  const Json::Value* value)
{
  std::unique_ptr<cmCMakePresetsGraph::Condition> ptr;
  auto result = ConditionHelper(ptr, value);
  if (ptr && ptr->IsNull()) {
    return ReadFileResult::INVALID_CONDITION;
  }
  out = std::move(ptr);
  return result;
}